

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void savegame(memfile *mf)

{
  xchar xVar1;
  s_level **ppsVar2;
  char cVar3;
  int iVar4;
  uint value;
  int i;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  store_version(mf);
  mwrite32(mf,flags.ident);
  mwrite32(mf,flags.moonphase);
  mwrite32(mf,flags.no_of_wizards);
  mwrite32(mf,flags.init_role);
  mwrite32(mf,flags.init_race);
  mwrite32(mf,flags.init_gend);
  mwrite32(mf,flags.init_align);
  mwrite32(mf,flags.randomall);
  mwrite32(mf,flags.pantheon);
  mwrite32(mf,flags.run);
  mwrite32(mf,flags.warntype);
  mwrite32(mf,flags.djinni_count);
  mwrite32(mf,flags.ghost_count);
  mwrite32(mf,flags.pickup_burden);
  mwrite8(mf,flags.autodig);
  mwrite8(mf,flags.autoquiver);
  mwrite8(mf,flags.autounlock);
  mwrite8(mf,flags.beginner);
  mwrite8(mf,flags.debug);
  mwrite8(mf,flags.explore);
  mwrite8(mf,flags.tutorial);
  mwrite8(mf,flags.female);
  mwrite8(mf,flags.forcefight);
  mwrite8(mf,flags.friday13);
  mwrite8(mf,flags.legacy);
  mwrite8(mf,flags.lit_corridor);
  mwrite8(mf,flags.made_amulet);
  mwrite8(mf,flags.mon_moving);
  mwrite8(mf,flags.move);
  mwrite8(mf,flags.mv);
  mwrite8(mf,flags.nopick);
  mwrite8(mf,flags.pickup);
  mwrite8(mf,flags.pushweapon);
  mwrite8(mf,flags.rest_on_space);
  mwrite8(mf,flags.safe_dog);
  mwrite8(mf,flags.safe_peaceful);
  mwrite8(mf,flags.silent);
  mwrite8(mf,flags.sortpack);
  mwrite8(mf,flags.soundok);
  mwrite8(mf,flags.sparkle);
  mwrite8(mf,flags.tombstone);
  mwrite8(mf,flags.verbose);
  mwrite8(mf,flags.prayconfirm);
  mwrite8(mf,flags.travel);
  mwrite8(mf,flags.end_disclose);
  mwrite8(mf,flags.menu_style);
  mwrite8(mf,flags.elbereth_enabled);
  mwrite8(mf,flags.rogue_enabled);
  mwrite8(mf,flags.seduce_enabled);
  mwrite8(mf,flags.bones_enabled);
  mwrite8(mf,flags.ascet);
  mwrite8(mf,flags.atheist);
  mwrite8(mf,flags.blindfolded);
  mwrite8(mf,flags.illiterate);
  mwrite8(mf,flags.pacifist);
  mwrite8(mf,flags.nudist);
  mwrite8(mf,flags.vegan);
  mwrite8(mf,flags.vegetarian);
  mwrite(mf,flags.inv_order,0x12);
  mwrite(mf,flags.spell_order,0x34);
  save_you(mf,&u);
  mwrite32(mf,moves);
  save_mon(mf,&youmonst);
  save_dungeon(mf);
  ppsVar2 = &sp_levchn;
  iVar4 = -1;
  do {
    ppsVar2 = &((s_level *)ppsVar2)->next->next;
    iVar4 = iVar4 + 1;
  } while ((s_level *)ppsVar2 != (s_level *)0x0);
  mwrite32(mf,iVar4);
  ppsVar2 = &sp_levchn;
  while (ppsVar2 = &((s_level *)ppsVar2)->next->next, (s_level *)ppsVar2 != (s_level *)0x0) {
    save_d_flags(mf,((s_level *)ppsVar2)->flags);
    mwrite(mf,&((s_level *)ppsVar2)->dlevel,2);
    mwrite(mf,((s_level *)ppsVar2)->proto,0xf);
    mwrite8(mf,((s_level *)ppsVar2)->boneid);
    mwrite8(mf,((s_level *)ppsVar2)->rndlevs);
  }
  iVar4 = 0;
  mtag(mf,0,MTAG_LEVELS);
  cVar3 = '\x01';
  while( true ) {
    xVar1 = maxledgerno();
    if (xVar1 < cVar3) break;
    iVar4 = (iVar4 + 1) - (uint)(levels[cVar3] == (level *)0x0);
    cVar3 = cVar3 + '\x01';
  }
  mwrite32(mf,iVar4);
  cVar3 = '\x01';
  while( true ) {
    xVar1 = maxledgerno();
    if (xVar1 < cVar3) break;
    if (levels[cVar3] != (level *)0x0) {
      mtag(mf,(long)cVar3,MTAG_LEVELS);
      mwrite8(mf,cVar3);
      savelev(mf,cVar3);
    }
    cVar3 = cVar3 + '\x01';
  }
  mtag(mf,0,MTAG_GAMESTATE);
  mfmagic_set(mf,0x54415453);
  save_timeout(mf);
  save_timers(mf,level,1);
  save_light_sources(mf,level,1);
  saveobjchn(mf,invent);
  saveobjchn(mf,magic_chest_objs);
  savemonchn(mf,migrating_mons);
  mtag(mf,0,MTAG_MVITALS);
  for (lVar5 = 2; lVar5 != 0x4bb; lVar5 = lVar5 + 3) {
    mwrite8(mf,*(int8_t *)((long)zeroobj.oextra + lVar5 + 2));
    mwrite8(mf,*(int8_t *)((long)zeroobj.oextra + lVar5 + 3));
    mwrite8(mf,(&mvitals[0].born)[lVar5]);
  }
  auVar6._4_4_ = quest_status._0_4_;
  auVar6._0_4_ = quest_status._0_4_;
  auVar6._8_4_ = quest_status._0_4_;
  auVar6._12_4_ = quest_status._0_4_;
  iVar4 = DAT_002b6c00._4_4_;
  auVar7._4_4_ = iVar4;
  auVar7._0_4_ = iVar4;
  auVar7._8_4_ = DAT_002b6c00._12_4_;
  auVar7._12_4_ = DAT_002b6c00._12_4_;
  mwrite32(mf,((uint)quest_status._0_4_ >> 1 & 0x8000) + (quest_status._0_4_ & 0x8000) * 2 |
              (uint)quest_status._0_4_ >> 9 & 0x800 | (uint)quest_status._0_4_ >> 7 & 0x1000 |
              (uint)quest_status._0_4_ >> 5 & 0x2000 | (uint)quest_status._0_4_ >> 3 & 0x4000 |
              (quest_status._0_4_ & 2) << 0x1d | quest_status._0_4_ << 0x1f |
              ((uint)((auVar7._8_8_ & 0xffffffff) * (ulong)(uint)quest_status._0_4_) & 0x1000000 |
               quest_status._0_4_ * 0x20 & 0x40000U |
               iVar4 * quest_status._0_4_ & 0x4000000U | quest_status._0_4_ * 0x2000 & 0x400000U |
              (uint)((DAT_002b6c00._8_8_ & 0xffffffff) * (ulong)(uint)quest_status._0_4_) &
              0x2000000 | (uint)((auVar6._8_8_ & 0xffffffff) * 0x200) & 0x380000 |
              (int)DAT_002b6c00 * quest_status._0_4_ & 0x38000000U |
              quest_status._0_4_ * 0x8000 & 0x800000U) + (quest_status._0_4_ & 0x4000) * 8);
  mwrite32(mf,quest_status.leader_m_id);
  for (lVar5 = 0; lVar5 != 0x2c; lVar5 = lVar5 + 1) {
    mwrite32(mf,spl_book[lVar5].sp_know);
    mwrite16(mf,spl_book[lVar5].sp_id);
    mwrite8(mf,spl_book[lVar5].sp_lev);
  }
  save_artifacts(mf);
  save_oracles(mf);
  save_tutorial(mf);
  mwrite(mf,pl_character,0x20);
  mwrite(mf,pl_fruit,0x20);
  mwrite32(mf,current_fruit);
  savefruitchn(mf);
  savenames(mf);
  save_waterlevel(mf);
  mwrite32(mf,lastinvnr);
  save_mt_state(mf);
  save_track(mf);
  save_food(mf);
  save_steal(mf);
  save_dig_status(mf);
  save_occupations(mf);
  if (book == (obj *)0x0) {
    value = 0;
  }
  else {
    value = book->o_id;
  }
  mwrite32(mf,value);
  mwrite32(mf,stetho_last_used_move);
  mwrite32(mf,stetho_last_used_movement);
  mwrite32(mf,multi);
  save_rndmonst_state(mf);
  save_history(mf);
  return;
}

Assistant:

void savegame(struct memfile *mf)
{
	int count = 0;
	xchar ltmp;

	/* no tag useful here as store_version adds one */
	store_version(mf);

	/* Place flags, player info & moves at the beginning of the save.
	 * This makes it possible to read them in nh_get_savegame_status without
	 * parsing all the dungeon and level data */
	save_flags(mf);
	save_you(mf, &u);
	mwrite32(mf, moves); /* no tag useful here; you is fixed-length */
	save_mon(mf, &youmonst);

	/* store dungeon layout */
	save_dungeon(mf);
	savelevchn(mf);

	/* store levels */
	mtag(mf, 0, MTAG_LEVELS);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++)
	    if (levels[ltmp])
		count++;
	mwrite32(mf, count);
	for (ltmp = 1; ltmp <= maxledgerno(); ltmp++) {
		if (!levels[ltmp])
		    continue;
		mtag(mf, ltmp, MTAG_LEVELS);
		mwrite8(mf, ltmp); /* level number*/
		savelev(mf, ltmp); /* actual level*/
	}
	savegamestate(mf);
}